

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::HierarchyInstantiationSyntax::HierarchyInstantiationSyntax
          (HierarchyInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token type,
          ParameterValueAssignmentSyntax *parameters,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar6 = type._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = HierarchyInstantiation;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00623138;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(HierarchyInstantiationSyntax **)(*(long *)((long)ppAVar2 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->type).kind = (short)uVar6;
  (this->type).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->type).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->type).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->type).info = type.info;
  this->parameters = parameters;
  uVar4 = *(undefined4 *)&(instances->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (instances->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.kind =
       (instances->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->instances).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (instances->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->instances).super_SyntaxListBase.childCount = (instances->super_SyntaxListBase).childCount;
  (this->instances).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623ea0
  ;
  sVar1 = (instances->elements)._M_extent._M_extent_value;
  (this->instances).elements._M_ptr = (instances->elements)._M_ptr;
  (this->instances).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (parameters != (ParameterValueAssignmentSyntax *)0x0) {
    (parameters->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar8 = (this->instances).elements._M_extent._M_extent_value + 1;
  if (1 < uVar8) {
    uVar8 = uVar8 >> 1;
    lVar7 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->instances).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar5)->parent = (SyntaxNode *)this;
      lVar7 = lVar7 + 0x30;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

HierarchyInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token type, ParameterValueAssignmentSyntax* parameters, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::HierarchyInstantiation, attributes), type(type), parameters(parameters), instances(instances), semi(semi) {
        if (this->parameters) this->parameters->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }